

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

_Bool enum_dir_next(DIR *dp,int index,strbuf *out)

{
  BinarySink *bs;
  uchar val;
  uchar uVar1;
  uchar uVar2;
  size_t new_len;
  int iVar3;
  strbuf *buf;
  char *pcVar4;
  size_t sVar5;
  dirent *pdVar6;
  char cVar7;
  char cVar8;
  ptrlen pl;
  ptrlen pl_00;
  stat st;
  stat local_c0;
  
  if (dp == (DIR *)0x0) {
    return false;
  }
  buf = strbuf_new();
  pcVar4 = make_filename(index,(char *)0x0);
  bs = buf->binarysink_;
  sVar5 = strlen(pcVar4);
  pl.len = sVar5;
  pl.ptr = pcVar4;
  BinarySink_put_datapl(bs,pl);
  safefree(pcVar4);
  BinarySink_put_byte(bs,'/');
  new_len = buf->len;
  pdVar6 = readdir((DIR *)dp);
  if (pdVar6 != (dirent *)0x0) {
    do {
      strbuf_shrink_to(buf,new_len);
      pcVar4 = pdVar6->d_name;
      sVar5 = strlen(pcVar4);
      pl_00.len = sVar5;
      pl_00.ptr = pcVar4;
      BinarySink_put_datapl(bs,pl_00);
      iVar3 = stat(buf->s,&local_c0);
      if ((-1 < iVar3) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
        goto LAB_0014229d;
      }
      pdVar6 = readdir((DIR *)dp);
    } while (pdVar6 != (dirent *)0x0);
  }
  strbuf_free(buf);
  return false;
LAB_0014229d:
  val = *pcVar4;
  if (val != '%') {
    if (val == '\0') {
      strbuf_free(buf);
      return true;
    }
LAB_001422f0:
    pcVar4 = pcVar4 + 1;
    BinarySink_put_byte(out->binarysink_,val);
    goto LAB_0014229d;
  }
  uVar1 = pcVar4[1];
  if ((uVar1 == '\0') || (uVar2 = pcVar4[2], uVar2 == '\0')) goto LAB_001422f0;
  cVar7 = '9';
  if ((char)uVar1 < ':') {
    cVar7 = '\0';
  }
  cVar8 = -7;
  if ((char)uVar2 < ':') {
    cVar8 = '\0';
  }
  BinarySink_put_byte(out->binarysink_,uVar2 + cVar8 + (cVar7 + uVar1) * '\x10' + 0xd0);
  pcVar4 = pcVar4 + 3;
  goto LAB_0014229d;
}

Assistant:

static bool enum_dir_next(DIR *dp, int index, strbuf *out)
{
    struct dirent *de;
    struct stat st;
    strbuf *fullpath;

    if (!dp)
        return false;

    fullpath = strbuf_new();

    char *sessiondir = make_filename(index, NULL);
    put_dataz(fullpath, sessiondir);
    sfree(sessiondir);
    put_byte(fullpath, '/');

    size_t baselen = fullpath->len;

    while ( (de = readdir(dp)) != NULL ) {
        strbuf_shrink_to(fullpath, baselen);
        put_dataz(fullpath, de->d_name);

        if (stat(fullpath->s, &st) < 0 || !S_ISREG(st.st_mode))
            continue;                  /* try another one */

        decode_session_filename(de->d_name, out);
        strbuf_free(fullpath);
        return true;
    }

    strbuf_free(fullpath);
    return false;
}